

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffihtps(void)

{
  int iVar1;
  undefined4 local_c;
  int status;
  
  local_c = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    local_c = -1;
  }
  return local_c;
}

Assistant:

int ffihtps(void)
{
   /* Wrapper function for global initialization of curl library.
      This is NOT THREAD-SAFE */
   int status=0;
#ifdef CFITSIO_HAVE_CURL
   if (curl_global_init(CURL_GLOBAL_ALL))
      /* Do we want to define a new CFITSIO error code for this? */
      status = -1;
#endif
   return status;
}